

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O1

int __thiscall
CConsole::PossibleCommands
          (CConsole *this,char *pStr,int FlagMask,bool Temp,FPossibleCallback pfnCallback,
          void *pUser)

{
  char *pcVar1;
  CCommand *pCVar2;
  int iVar3;
  
  pCVar2 = this->m_pFirstCommand;
  if (pCVar2 == (CCommand *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      if ((((pCVar2->m_Flags & FlagMask) != 0) && (pCVar2->m_Temp == Temp)) &&
         (pcVar1 = str_find_nocase((pCVar2->super_CCommandInfo).m_pName,pStr), pcVar1 != (char *)0x0
         )) {
        (*pfnCallback)(iVar3,(pCVar2->super_CCommandInfo).m_pName,pUser);
        iVar3 = iVar3 + 1;
      }
      pCVar2 = pCVar2->m_pNext;
    } while (pCVar2 != (CCommand *)0x0);
  }
  return iVar3;
}

Assistant:

int CConsole::PossibleCommands(const char *pStr, int FlagMask, bool Temp, FPossibleCallback pfnCallback, void *pUser)
{
	int Index = 0;
	for(CCommand *pCommand = m_pFirstCommand; pCommand; pCommand = pCommand->m_pNext)
	{
		if(pCommand->m_Flags&FlagMask && pCommand->m_Temp == Temp && str_find_nocase(pCommand->m_pName, pStr))
		{
			pfnCallback(Index, pCommand->m_pName, pUser);
			Index++;
		}
	}
	return Index;
}